

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_test.cc
# Opt level: O0

void __thiscall GraphTestPhonySelfReferenceError::Run(GraphTestPhonySelfReferenceError *this)

{
  Test *pTVar1;
  bool bVar2;
  Node *node;
  allocator<char> local_61;
  string local_60;
  undefined1 local_40 [8];
  string err;
  ManifestParserOptions local_18;
  ManifestParserOptions parser_opts;
  GraphTestPhonySelfReferenceError *this_local;
  
  parser_opts = (ManifestParserOptions)this;
  ManifestParserOptions::ManifestParserOptions(&local_18);
  local_18.phony_cycle_action_ = kPhonyCycleActionError;
  err.field_2._12_4_ = kPhonyCycleActionError;
  err.field_2._8_4_ = local_18.dupe_edge_action_;
  AssertParse(&(this->super_GraphTest).super_StateTestWithBuiltinRules.state_,"build a: phony a\n",
              (ManifestParserOptions)err.field_2._8_8_);
  std::__cxx11::string::string((string *)local_40);
  pTVar1 = g_current_test;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"a",&local_61);
  node = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,&local_60);
  bVar2 = DependencyScan::RecomputeDirty(&(this->super_GraphTest).scan_,node,(string *)local_40);
  testing::Test::Check
            (pTVar1,(bool)(~bVar2 & 1),
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/graph_test.cc"
             ,0x150,"scan_.RecomputeDirty(GetNode(\"a\"), &err)");
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  pTVar1 = g_current_test;
  bVar2 = std::operator==("dependency cycle: a -> a [-w phonycycle=err]",
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_40);
  bVar2 = testing::Test::Check
                    (pTVar1,bVar2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/graph_test.cc"
                     ,0x151,"\"dependency cycle: a -> a [-w phonycycle=err]\" == err");
  if (!bVar2) {
    testing::Test::AddAssertionFailure(g_current_test);
  }
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

TEST_F(GraphTest, PhonySelfReferenceError) {
  ManifestParserOptions parser_opts;
  parser_opts.phony_cycle_action_ = kPhonyCycleActionError;
  AssertParse(&state_,
"build a: phony a\n",
  parser_opts);

  string err;
  EXPECT_FALSE(scan_.RecomputeDirty(GetNode("a"), &err));
  ASSERT_EQ("dependency cycle: a -> a [-w phonycycle=err]", err);
}